

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O3

void * __thiscall
embree::SharedLazyTessellationCache::realloc
          (SharedLazyTessellationCache *this,void *__ptr,size_t __size)

{
  float *pfVar1;
  ulong uVar2;
  ulong *puVar3;
  bool bVar4;
  
  do {
    do {
    } while (((this->reset_state).flag.super_atomic<bool>._M_base._M_i & 1U) != 0);
    LOCK();
    bVar4 = (this->reset_state).flag.super_atomic<bool>._M_base._M_i == false;
    if (bVar4) {
      (this->reset_state).flag.super_atomic<bool>._M_base._M_i = true;
    }
    UNLOCK();
  } while (!bVar4);
  do {
    do {
    } while (((this->linkedlist_mtx).flag.super_atomic<bool>._M_base._M_i & 1U) != 0);
    LOCK();
    bVar4 = (this->linkedlist_mtx).flag.super_atomic<bool>._M_base._M_i == false;
    if (bVar4) {
      (this->linkedlist_mtx).flag.super_atomic<bool>._M_base._M_i = true;
    }
    UNLOCK();
    puVar3 = current_t_state;
  } while (!bVar4);
  for (; puVar3 != (ulong *)0x0; puVar3 = (ulong *)puVar3[1]) {
    LOCK();
    uVar2 = *puVar3;
    *puVar3 = *puVar3 + 4;
    UNLOCK();
    if (uVar2 != 0) {
      uVar2 = *puVar3;
      while (4 < uVar2) {
        uVar2 = *puVar3;
      }
    }
  }
  if (this->data != (float *)0x0) {
    os_free(this->data,this->size,this->hugepages);
  }
  this->size = (size_t)__ptr;
  this->data = (float *)0x0;
  if (__ptr == (void *)0x0) {
    uVar2 = 0;
  }
  else {
    pfVar1 = (float *)os_malloc((size_t)__ptr,&this->hugepages);
    this->data = pfVar1;
    uVar2 = this->size >> 6;
  }
  this->maxBlocks = uVar2;
  LOCK();
  (this->localTime).super___atomic_base<unsigned_long>._M_i =
       (this->localTime).super___atomic_base<unsigned_long>._M_i + 8;
  UNLOCK();
  LOCK();
  (this->next_block).super___atomic_base<unsigned_long>._M_i =
       (this->maxBlocks >> 3) *
       (ulong)((uint)(this->localTime).super___atomic_base<unsigned_long>._M_i & 7);
  UNLOCK();
  LOCK();
  (this->switch_block_threshold).super___atomic_base<unsigned_long>._M_i =
       (this->maxBlocks >> 3) + (this->next_block).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  for (puVar3 = current_t_state; puVar3 != (ulong *)0x0; puVar3 = (ulong *)puVar3[1]) {
    LOCK();
    *puVar3 = *puVar3 - 4;
    UNLOCK();
  }
  (this->linkedlist_mtx).flag.super_atomic<bool>._M_base._M_i = false;
  (this->reset_state).flag.super_atomic<bool>._M_base._M_i = false;
  return (void *)0x0;
}

Assistant:

void SharedLazyTessellationCache::realloc(const size_t new_size)
  {
    /* lock the reset_state */
    reset_state.lock();

    /* lock the linked list of thread states */
    linkedlist_mtx.lock();

    /* block all threads */
    for (ThreadWorkState *t=current_t_state;t!=nullptr;t=t->next)
      if (lockThread(t,THREAD_BLOCK_ATOMIC_ADD) != 0)
        waitForUsersLessEqual(t,THREAD_BLOCK_ATOMIC_ADD);

    /* reallocate data */
    if (data) os_free(data,size,hugepages);
    size      = new_size;
    data      = nullptr;
    if (size) data = (float*)os_malloc(size,hugepages);
    maxBlocks = size/BLOCK_SIZE;    

    /* invalidate entire cache */
    localTime += NUM_CACHE_SEGMENTS; 

    /* reset to the first segment */
#if FORCE_SIMPLE_FLUSH == 1
    next_block = 0;
    switch_block_threshold = maxBlocks;
#else
    const size_t region = localTime % NUM_CACHE_SEGMENTS;
    next_block = region * (maxBlocks/NUM_CACHE_SEGMENTS);
    switch_block_threshold = next_block + (maxBlocks/NUM_CACHE_SEGMENTS);
    assert( switch_block_threshold <= maxBlocks );
#endif

    /* release all blocked threads */
    for (ThreadWorkState *t=current_t_state;t!=nullptr;t=t->next)
      unlockThread(t,-THREAD_BLOCK_ATOMIC_ADD);

    /* unlock the linked list of thread states */
    linkedlist_mtx.unlock();	    

    /* unlock the reset_state */
    reset_state.unlock();
  }